

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O1

void Wlc_NtkCollectBoxes(Wlc_Ntk_t *p,Vec_Int_t *vBoxIds)

{
  uint Entry;
  Vec_Int_t *p_00;
  int *piVar1;
  int iVar2;
  long lVar3;
  
  Entry = vBoxIds->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < Entry) {
    iVar2 = Entry + 1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  if (iVar2 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar2 << 2);
  }
  p_00->pArray = piVar1;
  Vec_IntPush(p_00,Entry);
  if (0 < vBoxIds->nSize) {
    lVar3 = 0;
    do {
      iVar2 = vBoxIds->pArray[lVar3];
      if (((long)iVar2 < 0) || ((p->vNameIds).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,(p->vNameIds).pArray[iVar2]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vBoxIds->nSize);
  }
  piVar1 = p_00->pArray;
  p_00->nCap = 0;
  p_00->nSize = 0;
  p_00->pArray = (int *)0x0;
  Abc_FrameSetBoxes(piVar1);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collect adds and mults.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkCollectBoxes( Wlc_Ntk_t * p, Vec_Int_t * vBoxIds )
{
    int i, iObj;
    Vec_Int_t * vBoxes = Vec_IntAlloc( Vec_IntSize(vBoxIds) + 1 );
    Vec_IntPush( vBoxes, Vec_IntSize(vBoxIds) );
    Vec_IntForEachEntry( vBoxIds, iObj, i )
        Vec_IntPush( vBoxes, Wlc_ObjNameId(p, iObj) );
    Abc_FrameSetBoxes( Vec_IntReleaseArray(vBoxes) );
    Vec_IntFree( vBoxes );
}